

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

image<crnlib::color_quad<unsigned_char,_int>_> * __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::operator=
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,
          image<crnlib::color_quad<unsigned_char,_int>_> *other)

{
  bool bVar1;
  int iVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RSI;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RDI;
  uint total_pixels;
  vector<crnlib::color_quad<unsigned_char,_int>_> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_00;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    this_00 = in_RDI;
    bVar1 = vector<crnlib::color_quad<unsigned_char,_int>_>::empty(&in_RSI->m_pixel_buf);
    if (bVar1) {
      iVar2 = in_RSI->m_pitch * in_RSI->m_height;
      if ((iVar2 == 0) || (in_RSI->m_pPixels == (color_quad<unsigned_char,_int> *)0x0)) {
        vector<crnlib::color_quad<unsigned_char,_int>_>::clear(in_stack_ffffffffffffffd0);
        in_RDI->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
      }
      else {
        vector<crnlib::color_quad<unsigned_char,_int>_>::resize
                  ((vector<crnlib::color_quad<unsigned_char,_int>_> *)
                   CONCAT44(iVar2,in_stack_ffffffffffffffe0),(uint)((ulong)in_RDI >> 0x20),
                   SUB81((ulong)in_RDI >> 0x18,0));
        vector<crnlib::color_quad<unsigned_char,_int>_>::size(&in_RDI->m_pixel_buf);
        vector<crnlib::color_quad<unsigned_char,_int>_>::insert
                  ((vector<crnlib::color_quad<unsigned_char,_int>_> *)this_00,
                   (uint)((ulong)in_RSI >> 0x20),
                   (color_quad<unsigned_char,_int> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                   (uint)((ulong)in_RDI >> 0x20));
        pcVar3 = vector<crnlib::color_quad<unsigned_char,_int>_>::front(&in_RDI->m_pixel_buf);
        in_RDI->m_pPixels = pcVar3;
      }
    }
    else {
      vector<crnlib::color_quad<unsigned_char,_int>_>::operator=
                ((vector<crnlib::color_quad<unsigned_char,_int>_> *)in_RDI,in_stack_ffffffffffffffd0
                );
      pcVar3 = vector<crnlib::color_quad<unsigned_char,_int>_>::front(&in_RDI->m_pixel_buf);
      in_RDI->m_pPixels = pcVar3;
    }
    in_RDI->m_width = in_RSI->m_width;
    in_RDI->m_height = in_RSI->m_height;
    in_RDI->m_pitch = in_RSI->m_pitch;
    in_RDI->m_total = in_RSI->m_total;
    in_RDI->m_comp_flags = in_RSI->m_comp_flags;
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

image& operator=(const image& other) {
    if (this == &other)
      return *this;

    if (other.m_pixel_buf.empty()) {
      // This doesn't look very safe - let's make a new instance.
      //m_pixel_buf.clear();
      //m_pPixels = other.m_pPixels;

      const uint total_pixels = other.m_pitch * other.m_height;
      if ((total_pixels) && (other.m_pPixels)) {
        m_pixel_buf.resize(total_pixels);
        m_pixel_buf.insert(0, other.m_pPixels, m_pixel_buf.size());
        m_pPixels = &m_pixel_buf.front();
      } else {
        m_pixel_buf.clear();
        m_pPixels = NULL;
      }
    } else {
      m_pixel_buf = other.m_pixel_buf;
      m_pPixels = &m_pixel_buf.front();
    }

    m_width = other.m_width;
    m_height = other.m_height;
    m_pitch = other.m_pitch;
    m_total = other.m_total;
    m_comp_flags = other.m_comp_flags;

    return *this;
  }